

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

filtration_entry_t __thiscall
tournser::
add_coboundary_and_get_pivot<priority_queue_t<std::vector<filtration_entry_t,std::allocator<filtration_entry_t>>,greater_filtration_or_smaller_index<filtration_entry_t>>,std::_Deque_iterator<filtration_entry_t,filtration_entry_t_const&,filtration_entry_t_const*>>
          (tournser *this,
          _Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*>
          *column_begin,
          _Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*>
          *column_end,
          priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
          *working_coboundary,index_t *dim,
          priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_smaller_index<filtration_entry_t>_>
          *reduction_column)

{
  pointer pfVar1;
  long lVar2;
  _Elt_pointer pfVar3;
  ulong uVar4;
  float fVar5;
  undefined4 uVar6;
  filtration_entry_t fVar7;
  _Map_pointer local_a0;
  _Elt_pointer local_98;
  simplex_coboundary_enumerator cofaces;
  filtration_entry_t simplex;
  filtration_entry_t coface;
  
  pfVar3 = column_begin->_M_cur;
  local_98 = column_begin->_M_last;
  local_a0 = column_begin->_M_node;
  uVar4 = 0;
  do {
    if (pfVar3 == column_end->_M_cur) {
      fVar7 = priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
              ::get_pivot(working_coboundary);
      lVar2 = fVar7.super_pair<float,_long>.second;
      fVar5 = fVar7.super_pair<float,_long>.first;
      uVar6 = fVar7.super_pair<float,_long>._4_4_;
LAB_001292d7:
      fVar7.super_pair<float,_long>._4_4_ = uVar6;
      fVar7.super_pair<float,_long>.first = fVar5;
      fVar7.super_pair<float,_long>.second = lVar2;
      return (filtration_entry_t)fVar7.super_pair<float,_long>;
    }
    simplex.super_pair<float,_long>.first = (pfVar3->super_pair<float,_long>).first;
    simplex.super_pair<float,_long>._4_4_ =
         *(undefined4 *)&(pfVar3->super_pair<float,_long>).field_0x4;
    simplex.super_pair<float,_long>.second = (pfVar3->super_pair<float,_long>).second;
    std::
    priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_smaller_index<filtration_entry_t>_>
    ::push(reduction_column,&simplex);
    pfVar1 = (this->coface_entries).
             super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->coface_entries).
        super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar1) {
      (this->coface_entries).
      super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar1;
    }
    cofaces.dim = *dim;
    cofaces.complex = this->complex;
    cofaces.idx_above = 0;
    cofaces.simplex =
         (delta_complex_cell_t *)
         (simplex.super_pair<float,_long>.second * 0xe8 +
         *(long *)&((cofaces.complex)->cells).
                   super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[cofaces.dim].
                   super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>.
                   _M_impl);
    while ((ulong)cofaces.idx_above <
           (ulong)((long)((cofaces.simplex)->coboundary).
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)((cofaces.simplex)->coboundary).
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3)) {
      fVar7 = simplex_coboundary_enumerator::next(&cofaces);
      coface.super_pair<float,_long>.second = fVar7.super_pair<float,_long>.second;
      coface.super_pair<float,_long>.first = fVar7.super_pair<float,_long>.first;
      uVar4 = uVar4 + 1;
      priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
      ::push(working_coboundary,&coface);
    }
    if (this->max_entries < uVar4) {
      fVar5 = 0.0;
      uVar6 = 0;
      lVar2 = -2;
      goto LAB_001292d7;
    }
    pfVar3 = pfVar3 + 1;
    if (pfVar3 == local_98) {
      pfVar3 = local_a0[1];
      local_a0 = local_a0 + 1;
      local_98 = pfVar3 + 0x20;
    }
  } while( true );
}

Assistant:

filtration_entry_t tournser::add_coboundary_and_get_pivot(
    Iterator column_begin, Iterator column_end,
    Column& working_coboundary, const index_t& dim,
    std::priority_queue<filtration_entry_t, std::deque<filtration_entry_t>, smaller_index<filtration_entry_t>>& reduction_column) {
	index_t iterations = 0;
	for (auto it = column_begin; it != column_end; ++it) {
		filtration_entry_t simplex = *it;

        reduction_column.push(simplex);

		coface_entries.clear();
		simplex_coboundary_enumerator cofaces(simplex, dim, complex);
		while (cofaces.has_next()) {
			filtration_entry_t coface = cofaces.next();

            iterations++;
            working_coboundary.push(coface);
		}
		if (iterations > max_entries) {
			return filtration_entry_t(0,-2);
		}
	}

	return working_coboundary.get_pivot();
}